

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O0

size_t mz_zip_file_read_func(void *pOpaque,mz_uint64 file_ofs,void *pBuf,size_t n)

{
  int iVar1;
  __off64_t _Var2;
  long __off;
  size_t in_RCX;
  void *in_RDX;
  long in_RSI;
  long in_RDI;
  mz_int64 cur_ofs;
  mz_zip_archive *pZip;
  undefined8 local_8;
  
  _Var2 = ftello64(*(FILE **)(*(long *)(in_RDI + 0x68) + 0x70));
  __off = *(long *)(*(long *)(in_RDI + 0x68) + 0x78) + in_RSI;
  if (__off < 0) {
LAB_001820d0:
    local_8 = 0;
  }
  else {
    if (_Var2 != __off) {
      iVar1 = fseeko64(*(FILE **)(*(long *)(in_RDI + 0x68) + 0x70),__off,0);
      if (iVar1 != 0) goto LAB_001820d0;
    }
    local_8 = fread(in_RDX,1,in_RCX,*(FILE **)(*(long *)(in_RDI + 0x68) + 0x70));
  }
  return local_8;
}

Assistant:

static size_t mz_zip_file_read_func(void* pOpaque, mz_uint64 file_ofs, void* pBuf, size_t n) {

    mz_zip_archive* pZip = (mz_zip_archive*)pOpaque;
    mz_int64 cur_ofs = MZ_FTELL64(pZip->m_pState->m_pFile);

    file_ofs += pZip->m_pState->m_file_archive_start_ofs;

    if (((mz_int64)file_ofs < 0) || (((cur_ofs != (mz_int64)file_ofs)) && (MZ_FSEEK64(pZip->m_pState->m_pFile,
                                                                                      (mz_int64)file_ofs,
                                                                                      SEEK_SET))))
        return 0;

    return MZ_FREAD(pBuf, 1, n, pZip->m_pState->m_pFile);
}